

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O1

void __thiscall QToolBarLayout::~QToolBarLayout(QToolBarLayout *this)

{
  QList<QToolBarItem_*> *this_00;
  QToolBarItem ***pppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  QToolBarItem *pQVar4;
  Data *pDVar5;
  Data *pDVar6;
  int iVar7;
  iterator iVar8;
  QWidgetAction *this_01;
  undefined4 extraout_var;
  
  *(undefined ***)&this->super_QLayout = &PTR_metaObject_0080c038;
  (this->super_QLayout).super_QLayoutItem._vptr_QLayoutItem =
       (_func_int **)&PTR__QToolBarLayout_0080c140;
  this_00 = &this->items;
  lVar3 = (this->items).d.size;
  while (lVar3 != 0) {
    iVar8 = QList<QToolBarItem_*>::begin(this_00);
    pQVar4 = *iVar8.i;
    pppQVar1 = &(this->items).d.ptr;
    *pppQVar1 = *pppQVar1 + 1;
    pqVar2 = &(this->items).d.size;
    *pqVar2 = *pqVar2 + -1;
    this_01 = (QWidgetAction *)QMetaObject::cast((QObject *)&QWidgetAction::staticMetaObject);
    if ((this_01 != (QWidgetAction *)0x0) && (pQVar4->customWidget == true)) {
      iVar7 = (*(pQVar4->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])(pQVar4);
      QWidgetAction::releaseWidget(this_01,(QWidget *)CONCAT44(extraout_var,iVar7));
    }
    if (pQVar4 != (QToolBarItem *)0x0) {
      (*(pQVar4->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[1])(pQVar4);
    }
    lVar3 = (this->items).d.size;
  }
  pDVar5 = (this->geomArray).d.d;
  if (pDVar5 != (Data *)0x0) {
    LOCK();
    (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->geomArray).d.d)->super_QArrayData,0x20,0x10);
    }
  }
  pDVar6 = (this_00->d).d;
  if (pDVar6 != (Data *)0x0) {
    LOCK();
    (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this_00->d).d)->super_QArrayData,8,0x10);
    }
  }
  QLayout::~QLayout(&this->super_QLayout);
  return;
}

Assistant:

QToolBarLayout::~QToolBarLayout()
{
    while (!items.isEmpty()) {
        QToolBarItem *item = items.takeFirst();
        if (QWidgetAction *widgetAction = qobject_cast<QWidgetAction*>(item->action)) {
            if (item->customWidget)
                widgetAction->releaseWidget(item->widget());
        }
        delete item;
    }
}